

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
optTyped_moveAssignmentNotEmptyForEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::
TestBody(optTyped_moveAssignmentNotEmptyForEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>
         *this)

{
  value_type_conflict *lhs;
  bool bVar1;
  bool *rhs;
  storage_type sVar2;
  char *pcVar3;
  AssertionResult gtest_ar_;
  storage_type local_39;
  Message local_38;
  AssertHelper local_30;
  internal local_28 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  local_39 = (storage_type)
             (this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_1;
  local_28[0] = (internal)0x1;
  local_20.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28[0] = (internal)0x1;
  local_20.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_39.value != true) {
    lhs = &(this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_1;
    testing::internal::CmpHelperEQ<bool,bool>(local_28,"this->value_1","*o2",lhs,&local_39.value);
    if (local_28[0] == (internal)0x0) {
      testing::Message::Message(&local_38);
      if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_20.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                 ,0x268,pcVar3);
      testing::internal::AssertHelper::operator=(&local_30,&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_30);
      if (CONCAT71(local_38.ss_.ptr_._1_7_,(byte)local_38.ss_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT71(local_38.ss_.ptr_._1_7_,(byte)local_38.ss_.ptr_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(local_38.ss_.ptr_._1_7_,(byte)local_38.ss_.ptr_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    rhs = mp::opt<bool,_mp::opt_default_policy<bool>_>::value
                    ((opt<bool,_mp::opt_default_policy<bool>_> *)&local_39);
    testing::internal::CmpHelperEQ<bool,bool>(local_28,"this->value_1","o2.value()",lhs,rhs);
    if (local_28[0] == (internal)0x0) {
      testing::Message::Message(&local_38);
      if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_20.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                 ,0x269,pcVar3);
      testing::internal::AssertHelper::operator=(&local_30,&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_30);
      if (CONCAT71(local_38.ss_.ptr_._1_7_,(byte)local_38.ss_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT71(local_38.ss_.ptr_._1_7_,(byte)local_38.ss_.ptr_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(local_38.ss_.ptr_._1_7_,(byte)local_38.ss_.ptr_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    sVar2 = (storage_type)
            (this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_2;
    if (local_39.value != true) {
      sVar2 = local_39;
    }
    local_38.ss_.ptr_._0_1_ = sVar2.null_value & 1;
    testing::internal::CmpHelperEQ<bool,bool>
              (local_28,"this->value_1","o2.value_or(this->value_2)",lhs,(bool *)&local_38);
    if (local_28[0] == (internal)0x0) {
      testing::Message::Message(&local_38);
      if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_20.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                 ,0x26a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_30,&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_30);
      if (CONCAT71(local_38.ss_.ptr_._1_7_,(byte)local_38.ss_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT71(local_38.ss_.ptr_._1_7_,(byte)local_38.ss_.ptr_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(local_38.ss_.ptr_._1_7_,(byte)local_38.ss_.ptr_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  __assert_fail("has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/include/opt.h",
                0xdf,
                "T &mp::opt<bool>::operator*() & [T = bool, Policy = mp::opt_default_policy<bool>]")
  ;
}

Assistant:

TYPED_TEST(optTyped, moveAssignmentNotEmptyForEmpty)
{
  using opt_type = typename TestFixture::type;
  opt_type o1{this->value_1};
  opt_type o2;
  o2 = std::move(o1);
  EXPECT_TRUE(o2);
  EXPECT_TRUE(o2.has_value());
  EXPECT_EQ(this->value_1, *o2);
  EXPECT_EQ(this->value_1, o2.value());
  EXPECT_EQ(this->value_1, o2.value_or(this->value_2));
}